

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_zlib_compress
               (uchar **out,size_t *outsize,uchar *in,size_t insize,
               LodePNGCompressSettings *settings)

{
  uint uVar1;
  uint value;
  size_t sVar2;
  size_t deflatesize;
  uchar *deflatedata;
  ucvector outv;
  
  deflatedata = (uchar *)0x0;
  deflatesize = 0;
  outv.data = *out;
  outv.size = *outsize;
  outv.allocsize = outv.size;
  ucvector_push_back(&outv,'x');
  ucvector_push_back(&outv,'\x01');
  if (settings->custom_deflate ==
      (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0) {
    uVar1 = lodepng_deflate(&deflatedata,&deflatesize,in,insize,settings);
  }
  else {
    uVar1 = (*settings->custom_deflate)(&deflatedata,&deflatesize,in,insize,settings);
  }
  if (uVar1 == 0) {
    value = adler32(in,(uint)insize);
    for (sVar2 = 0; sVar2 != deflatesize; sVar2 = sVar2 + 1) {
      ucvector_push_back(&outv,deflatedata[sVar2]);
    }
    free(deflatedata);
    lodepng_add32bitInt(&outv,value);
  }
  *out = outv.data;
  *outsize = outv.size;
  return uVar1;
}

Assistant:

unsigned lodepng_zlib_compress(unsigned char** out, size_t* outsize, const unsigned char* in,
	size_t insize, const LodePNGCompressSettings* settings)
{
	/*initially, *out must be NULL and outsize 0, if you just give some random *out
	that's pointing to a non allocated buffer, this'll crash*/
	ucvector outv;
	size_t i;
	unsigned error;
	unsigned char* deflatedata = 0;
	size_t deflatesize = 0;

	/*zlib data: 1 byte CMF (CM+CINFO), 1 byte FLG, deflate data, 4 byte ADLER32 checksum of the Decompressed data*/
	unsigned CMF = 120; /*0b01111000: CM 8, CINFO 7. With CINFO 7, any window size up to 32768 can be used.*/
	unsigned FLEVEL = 0;
	unsigned FDICT = 0;
	unsigned CMFFLG = 256 * CMF + FDICT * 32 + FLEVEL * 64;
	unsigned FCHECK = 31 - CMFFLG % 31;
	CMFFLG += FCHECK;

	/*ucvector-controlled version of the output buffer, for dynamic array*/
	ucvector_init_buffer(&outv, *out, *outsize);

	ucvector_push_back(&outv, (unsigned char)(CMFFLG >> 8));
	ucvector_push_back(&outv, (unsigned char)(CMFFLG & 255));

	error = deflate(&deflatedata, &deflatesize, in, insize, settings);

	if (!error)
	{
		unsigned ADLER32 = adler32(in, (unsigned)insize);
		for (i = 0; i != deflatesize; ++i) ucvector_push_back(&outv, deflatedata[i]);
		lodepng_free(deflatedata);
		lodepng_add32bitInt(&outv, ADLER32);
	}

	*out = outv.data;
	*outsize = outv.size;

	return error;
}